

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::InternalReserveSmallCapacityFromEmpty
          (ExtensionSet *this,size_t minimum_new_capacity)

{
  LogMessage *pLVar1;
  type_conflict5 tVar2;
  KeyValue *pKVar3;
  size_t new_flat_capacity;
  LogMessage local_70;
  Voidify local_5a;
  byte local_59;
  LogMessage local_58;
  Voidify local_45 [20];
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  size_t local_18;
  size_t minimum_new_capacity_local;
  ExtensionSet *this_local;
  
  local_31 = 0;
  local_18 = minimum_new_capacity;
  minimum_new_capacity_local = (size_t)this;
  if (this->flat_capacity_ != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x71b,"flat_capacity_ == 0");
    local_31 = 1;
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar1);
  }
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  local_59 = 0;
  if (0x100 < local_18) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x71c,"minimum_new_capacity <= kMaximumFlatCapacity");
    local_59 = 1;
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_45,pLVar1);
  }
  if ((local_59 & 1) == 0) {
    if (local_18 == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x71d,"minimum_new_capacity > 0");
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_5a,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_70);
    }
    tVar2 = absl::lts_20250127::bit_ceil<unsigned_long>(local_18);
    this->flat_capacity_ = (uint16_t)tVar2;
    pKVar3 = AllocateFlatMap(this->arena_,(uint16_t)tVar2);
    (this->map_).flat = pKVar3;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

void ExtensionSet::InternalReserveSmallCapacityFromEmpty(
    size_t minimum_new_capacity) {
  ABSL_DCHECK(flat_capacity_ == 0);
  ABSL_DCHECK(minimum_new_capacity <= kMaximumFlatCapacity);
  ABSL_DCHECK(minimum_new_capacity > 0);
  const size_t new_flat_capacity = absl::bit_ceil(minimum_new_capacity);
  flat_capacity_ = new_flat_capacity;
  map_.flat = AllocateFlatMap(arena_, new_flat_capacity);
}